

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O2

ktx_error_code_e ktxHashList_Sort(ktxHashList *pHead)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  UT_hash_handle *pUVar4;
  UT_hash_handle *pUVar5;
  UT_hash_handle *pUVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  UT_hash_handle *pUVar10;
  int iVar11;
  int iVar12;
  UT_hash_handle *pUVar13;
  UT_hash_handle *local_48;
  
  if (pHead == (ktxHashList *)0x0) {
    return KTX_INVALID_VALUE;
  }
  if (*pHead != (ktxHashList)0x0) {
    iVar11 = 1;
    bVar2 = true;
    pUVar4 = &(*pHead)->hh;
    while (bVar2) {
      uVar3 = 0;
      local_48 = (UT_hash_handle *)0x0;
      pUVar6 = (UT_hash_handle *)0x0;
LAB_001ec3e8:
      if (pUVar4 != (UT_hash_handle *)0x0) {
        uVar3 = uVar3 + 1;
        pUVar13 = pUVar4;
        for (iVar8 = 1; pUVar5 = pUVar4, iVar12 = iVar11, iVar9 = iVar11, iVar8 - iVar11 != 1;
            iVar8 = iVar8 + 1) {
          if (pUVar13->next == (void *)0x0) {
            pUVar13 = (UT_hash_handle *)0x0;
            iVar9 = iVar8;
            break;
          }
          pUVar13 = (UT_hash_handle *)((long)pUVar13->next + (((*pHead)->hh).tbl)->hho);
        }
        do {
          pUVar4 = pUVar13;
          pUVar10 = pUVar5;
          if (iVar9 == 0) {
            if (pUVar4 == (UT_hash_handle *)0x0 || iVar12 == 0) goto LAB_001ec3e8;
            if (pUVar4->next == (void *)0x0) {
              pUVar13 = (UT_hash_handle *)0x0;
            }
            else {
              pUVar13 = (UT_hash_handle *)((long)pUVar4->next + (((*pHead)->hh).tbl)->hho);
            }
            iVar12 = iVar12 + -1;
            iVar9 = 0;
          }
          else {
            pUVar13 = pUVar4;
            if (pUVar4 == (UT_hash_handle *)0x0 || iVar12 == 0) {
              if (pUVar5->next == (void *)0x0) {
                pUVar10 = (UT_hash_handle *)0x0;
              }
              else {
                pUVar10 = (UT_hash_handle *)((long)pUVar5->next + (((*pHead)->hh).tbl)->hho);
              }
              iVar9 = iVar9 + -1;
              pUVar4 = pUVar5;
            }
            else {
              lVar1 = (((*pHead)->hh).tbl)->hho;
              iVar8 = sort_by_key_codepoint
                                ((ktxKVListEntry *)((long)pUVar5 - lVar1),
                                 (ktxKVListEntry *)((long)pUVar4 - lVar1));
              if (iVar8 < 1) {
                pUVar10 = (UT_hash_handle *)(lVar1 + (long)pUVar5->next);
                if (pUVar5->next == (void *)0x0) {
                  pUVar10 = (UT_hash_handle *)0x0;
                }
                iVar9 = iVar9 + -1;
                pUVar4 = pUVar5;
              }
              else {
                pUVar13 = (UT_hash_handle *)(lVar1 + (long)pUVar4->next);
                if (pUVar4->next == (void *)0x0) {
                  pUVar13 = (UT_hash_handle *)0x0;
                }
                iVar12 = iVar12 + -1;
              }
            }
          }
          if (pUVar6 == (UT_hash_handle *)0x0) {
            pvVar7 = (void *)0x0;
            local_48 = pUVar4;
          }
          else {
            pUVar6->next = (void *)((long)pUVar4 - (((*pHead)->hh).tbl)->hho);
            pvVar7 = (void *)((long)pUVar6 - (((*pHead)->hh).tbl)->hho);
          }
          pUVar4->prev = pvVar7;
          pUVar5 = pUVar10;
          pUVar6 = pUVar4;
        } while( true );
      }
      pUVar6->next = (void *)0x0;
      if (uVar3 < 2) {
        (((*pHead)->hh).tbl)->tail = pUVar6;
        *pHead = (ktxHashList)((long)local_48 - (((*pHead)->hh).tbl)->hho);
      }
      bVar2 = uVar3 >= 2;
      iVar11 = iVar11 * 2;
      pUVar4 = local_48;
    }
  }
  return KTX_SUCCESS;
}

Assistant:

KTX_error_code
ktxHashList_Sort(ktxHashList* pHead)
{
    if (pHead) {
        //ktxKVListEntry* kv = (ktxKVListEntry*)pHead;

        HASH_SORT(*pHead, sort_by_key_codepoint);
        return KTX_SUCCESS;
    } else {
        return KTX_INVALID_VALUE;
    }
}